

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O0

void __thiscall net_tests::anon_unknown_17::V2TransportTester::ReceiveKey(V2TransportTester *this)

{
  Span<const_std::byte> ellswift;
  bool bVar1;
  const_iterator __last;
  const_iterator __first;
  long in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  long in_FS_OFFSET;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  assertion_result *in_stack_fffffffffffffe88;
  const_string *in_stack_fffffffffffffea0;
  size_t line_num;
  const_string *file;
  unit_test_log_t *this_01;
  const_string local_c0 [2];
  lazy_ostream local_a0 [2];
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  EllSwiftPubKey *in_stack_ffffffffffffffa0;
  BIP324Cipher *in_stack_ffffffffffffffa8;
  EllSwiftPubKey local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    file = (const_string *)&stack0xffffffffffffffa8;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe88,
               (pointer)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               (unsigned_long)in_stack_fffffffffffffe78);
    this_01 = (unit_test_log_t *)&stack0xffffffffffffff98;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,file,line_num,in_stack_fffffffffffffea0);
    __last._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_fffffffffffffe78);
    EllSwiftPubKey::size();
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffe88,(bool)in_stack_fffffffffffffe87);
    __first._M_current = (uchar *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe88,
               (pointer)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               (unsigned_long)in_stack_fffffffffffffe78);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               (basic_cstring<const_char> *)in_stack_fffffffffffffe78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe88,
               (pointer)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               (unsigned_long)in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe78 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xffffffffffffff80,local_a0,local_c0,0x490,REQUIRE,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffe78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe78);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x8d0);
  MakeByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe88);
  EllSwiftPubKey::size();
  Span<const_std::byte>::first
            ((Span<const_std::byte> *)in_stack_fffffffffffffe88,
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  ellswift.m_size = line_num;
  ellswift.m_data = (byte *)this_00;
  EllSwiftPubKey::EllSwiftPubKey(&local_48,ellswift);
  BIP324Cipher::Initialize
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f,
             (bool)in_stack_ffffffffffffff9e);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffe88,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  EllSwiftPubKey::size();
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)in_stack_fffffffffffffe88,
            CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffe88,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase(this_00,__first,__last);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReceiveKey()
    {
        // When processing a key, enough bytes need to have been received already.
        BOOST_REQUIRE(m_received.size() >= EllSwiftPubKey::size());
        // Initialize the cipher using it (acting as the opposite side of the tested transport).
        m_cipher.Initialize(MakeByteSpan(m_received).first(EllSwiftPubKey::size()), !m_test_initiator);
        // Strip the processed bytes off the front of the receive buffer.
        m_received.erase(m_received.begin(), m_received.begin() + EllSwiftPubKey::size());
    }